

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::sortTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                 *__return_storage_ptr__,IConfig *config,
                vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                *unsortedTestCases)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  iterator iVar4;
  iterator iVar5;
  size_type sVar6;
  TestCaseInfo *t;
  iterator iVar7;
  iterator iVar8;
  ReusableStringStream *pRVar9;
  SourceLineInfo local_110;
  ReusableStringStream local_100;
  string local_f0;
  reference local_d0;
  pair<unsigned_long,_Catch::TestCaseHandle> *indexed;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  *__range3_1;
  uint32_t local_94;
  reference local_90;
  TestCaseHandle *handle;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range3;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  indexed_tests;
  TestCaseInfoHasher h;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *unsortedTestCases_local;
  IConfig *config_local;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *sorted;
  
  iVar2 = (*config->_vptr_IConfig[0x10])();
  if (iVar2 == 0) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  else if (iVar2 == 1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    iVar4 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                      (__return_storage_ptr__);
    iVar5 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                      (__return_storage_ptr__);
    std::
    sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>
              (iVar4._M_current,iVar5._M_current);
  }
  else {
    if (iVar2 != 2) {
      ReusableStringStream::ReusableStringStream(&local_100);
      SourceLineInfo::SourceLineInfo
                (&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                 ,0x1850);
      pRVar9 = ReusableStringStream::operator<<(&local_100,&local_110);
      pRVar9 = ReusableStringStream::operator<<(pRVar9,(char (*) [26])": Internal Catch2 error: ");
      pRVar9 = ReusableStringStream::operator<<(pRVar9,(char (*) [26])"Unknown test order value!");
      ReusableStringStream::str_abi_cxx11_(&local_f0,pRVar9);
      throw_logic_error(&local_f0);
    }
    seedRng(config);
    uVar3 = (*config->_vptr_IConfig[0x11])();
    TestCaseInfoHasher::TestCaseInfoHasher
              ((TestCaseInfoHasher *)
               &indexed_tests.
                super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::vector((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
              *)&__range3);
    sVar6 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                      (unsortedTestCases);
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::reserve((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               *)&__range3,sVar6);
    __end3 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                       (unsortedTestCases);
    handle = (TestCaseHandle *)
             std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                       (unsortedTestCases);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                       *)&handle), bVar1) {
      local_90 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                 ::operator*(&__end3);
      t = TestCaseHandle::getTestCaseInfo(local_90);
      local_94 = TestCaseInfoHasher::operator()
                           ((TestCaseInfoHasher *)
                            &indexed_tests.
                             super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,t);
      std::
      vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
      ::emplace_back<unsigned_int,Catch::TestCaseHandle_const&>
                ((vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
                  *)&__range3,&local_94,local_90);
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
      ::operator++(&__end3);
    }
    iVar7 = std::
            vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
            ::begin((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                     *)&__range3);
    iVar8 = std::
            vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
            ::end((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                   *)&__range3);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>
              (iVar7._M_current,iVar8._M_current);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__);
    sVar6 = std::
            vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
            ::size((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                    *)&__range3);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
              (__return_storage_ptr__,sVar6);
    __end3_1 = std::
               vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               ::begin((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                        *)&__range3);
    indexed = (pair<unsigned_long,_Catch::TestCaseHandle> *)
              std::
              vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
              ::end((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                     *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
                               *)&indexed), bVar1) {
      local_d0 = __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
                 ::operator*(&__end3_1);
      std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::push_back
                (__return_storage_ptr__,&local_d0->second);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
      ::operator++(&__end3_1);
    }
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::~vector((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               *)&__range3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCaseHandle> sortTests( IConfig const& config, std::vector<TestCaseHandle> const& unsortedTestCases ) {
        switch (config.runOrder()) {
        case TestRunOrder::Declared:
            return unsortedTestCases;

        case TestRunOrder::LexicographicallySorted: {
            std::vector<TestCaseHandle> sorted = unsortedTestCases;
            std::sort(
                sorted.begin(),
                sorted.end(),
                []( TestCaseHandle const& lhs, TestCaseHandle const& rhs ) {
                    return lhs.getTestCaseInfo() < rhs.getTestCaseInfo();
                }
            );
            return sorted;
        }
        case TestRunOrder::Randomized: {
            seedRng(config);
            using TestWithHash = std::pair<TestCaseInfoHasher::hash_t, TestCaseHandle>;

            TestCaseInfoHasher h{ config.rngSeed() };
            std::vector<TestWithHash> indexed_tests;
            indexed_tests.reserve(unsortedTestCases.size());

            for (auto const& handle : unsortedTestCases) {
                indexed_tests.emplace_back(h(handle.getTestCaseInfo()), handle);
            }

            std::sort( indexed_tests.begin(),
                       indexed_tests.end(),
                       []( TestWithHash const& lhs, TestWithHash const& rhs ) {
                           if ( lhs.first == rhs.first ) {
                               return lhs.second.getTestCaseInfo() <
                                      rhs.second.getTestCaseInfo();
                           }
                           return lhs.first < rhs.first;
                       } );

            std::vector<TestCaseHandle> randomized;
            randomized.reserve(indexed_tests.size());

            for (auto const& indexed : indexed_tests) {
                randomized.push_back(indexed.second);
            }

            return randomized;
        }
        }

        CATCH_INTERNAL_ERROR("Unknown test order value!");
    }